

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

int Curl_splayremove(Curl_tree *t,Curl_tree *removenode,Curl_tree **newroot)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  timediff_t tVar9;
  Curl_tree *pCVar10;
  curltime newer;
  curltime i;
  curltime i_00;
  curltime older;
  
  if (t == (Curl_tree *)0x0) {
    return 1;
  }
  uVar1 = (removenode->key).tv_sec;
  uVar2 = (removenode->key).tv_usec;
  older.tv_usec = uVar2;
  older.tv_sec = uVar1;
  newer._8_8_ = 0xffffffff;
  newer.tv_sec = -1;
  older._12_4_ = 0;
  tVar9 = Curl_timediff_us(newer,older);
  if (tVar9 == 0) {
    if (removenode->samen == removenode) {
      return 3;
    }
    pCVar10 = removenode->samep;
    pCVar10->samen = removenode->samen;
    removenode->samen->samep = pCVar10;
    removenode->samen = removenode;
  }
  else {
    uVar3 = (removenode->key).tv_sec;
    uVar4 = (removenode->key).tv_usec;
    i.tv_usec = uVar4;
    i.tv_sec = uVar3;
    i._12_4_ = 0;
    pCVar10 = Curl_splay(i,t);
    if (pCVar10 != removenode) {
      return 2;
    }
    t = pCVar10->samen;
    if (t == pCVar10) {
      if (pCVar10->smaller == (Curl_tree *)0x0) {
        t = pCVar10->larger;
      }
      else {
        uVar5 = (removenode->key).tv_sec;
        uVar6 = (removenode->key).tv_usec;
        i_00.tv_usec = uVar6;
        i_00.tv_sec = uVar5;
        i_00._12_4_ = 0;
        t = Curl_splay(i_00,pCVar10->smaller);
        t->larger = pCVar10->larger;
      }
    }
    else {
      iVar7 = (pCVar10->key).tv_usec;
      uVar8 = *(undefined4 *)&(pCVar10->key).field_0xc;
      (t->key).tv_sec = (pCVar10->key).tv_sec;
      (t->key).tv_usec = iVar7;
      *(undefined4 *)&(t->key).field_0xc = uVar8;
      t->larger = pCVar10->larger;
      t->smaller = pCVar10->smaller;
      t->samep = pCVar10->samep;
      pCVar10->samep->samen = t;
    }
  }
  *newroot = t;
  return 0;
}

Assistant:

int Curl_splayremove(struct Curl_tree *t,
                     struct Curl_tree *removenode,
                     struct Curl_tree **newroot)
{
  static const struct curltime KEY_NOTUSED = {
    ~0, -1
  }; /* will *NEVER* appear */
  struct Curl_tree *x;

  if(!t)
    return 1;

  DEBUGASSERT(removenode);

  if(compare(KEY_NOTUSED, removenode->key) == 0) {
    /* Key set to NOTUSED means it is a subnode within a 'same' linked list
       and thus we can unlink it easily. */
    if(removenode->samen == removenode)
      /* A non-subnode should never be set to KEY_NOTUSED */
      return 3;

    removenode->samep->samen = removenode->samen;
    removenode->samen->samep = removenode->samep;

    /* Ensures that double-remove gets caught. */
    removenode->samen = removenode;

    *newroot = t; /* return the same root */
    return 0;
  }

  t = Curl_splay(removenode->key, t);
  DEBUGASSERT(t);

  /* First make sure that we got the same root node as the one we want
     to remove, as otherwise we might be trying to remove a node that
     is not actually in the tree.

     We cannot just compare the keys here as a double remove in quick
     succession of a node with key != KEY_NOTUSED && same != NULL
     could return the same key but a different node. */
  if(t != removenode)
    return 2;

  /* Check if there is a list with identical sizes, as then we are trying to
     remove the root node of a list of nodes with identical keys. */
  x = t->samen;
  if(x != t) {
    /* 'x' is the new root node, we just make it use the root node's
       smaller/larger links */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;
  }
  else {
    /* Remove the root node */
    if(!t->smaller)
      x = t->larger;
    else {
      x = Curl_splay(removenode->key, t->smaller);
      DEBUGASSERT(x);
      x->larger = t->larger;
    }
  }

  *newroot = x; /* store new root pointer */

  return 0;
}